

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

void __thiscall Matrix<Rational>::inverseExt(Matrix<Rational> *this,Matrix<Rational> *ext)

{
  bool bVar1;
  uint uVar2;
  undefined8 uVar3;
  Rational *this_00;
  int *in_RSI;
  int *in_RDI;
  Matrix<Rational> *in_stack_00000050;
  Matrix<Rational> *in_stack_00000058;
  uint q;
  uint j_2;
  uint j_1;
  uint j;
  Rational coeff;
  uint i;
  Rational *in_stack_fffffffffffffdd8;
  row_t in_stack_fffffffffffffde0;
  row_t in_stack_fffffffffffffe00;
  Rational *in_stack_fffffffffffffe08;
  row_t in_stack_fffffffffffffe38;
  Rational *in_stack_fffffffffffffe40;
  row_t in_stack_fffffffffffffe48;
  MatrixRow<Rational_&> local_180 [9];
  MatrixRow<Rational_&> local_138;
  MatrixRow<Rational_&> local_130;
  MatrixRow<Rational_&> local_128 [9];
  uint local_dc;
  MatrixRow<Rational_&> local_d8;
  uint local_cc;
  MatrixRow<Rational_&> local_c8;
  uint local_bc;
  MatrixRow<Rational_&> local_b8;
  uint local_ac;
  MatrixRow<Rational_&> local_a8 [17];
  uint local_20;
  int *local_10;
  
  if (in_RDI[1] != *in_RDI) {
    uVar3 = __cxa_allocate_exception(0x10);
    matrix_error::runtime_error
              ((matrix_error *)in_stack_fffffffffffffde0.arr,(char *)in_stack_fffffffffffffdd8);
    __cxa_throw(uVar3,&matrix_error::typeinfo,matrix_error::~matrix_error);
  }
  if (*in_RDI == *in_RSI) {
    local_10 = in_RSI;
    uVar2 = gauss(in_stack_00000058,in_stack_00000050);
    if (uVar2 == in_RDI[1]) {
      local_20 = in_RDI[1];
      while (local_20 = local_20 - 1, local_20 != 0xffffffff) {
        Rational::Rational(in_stack_fffffffffffffde0.arr,(longlong)in_stack_fffffffffffffdd8);
        local_a8[0].arr = (Rational *)operator[](in_stack_fffffffffffffdd8,0);
        this_00 = MatrixRow<Rational_&>::operator[](local_a8,local_20);
        ::operator/(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00.arr);
        Rational::~Rational(in_stack_fffffffffffffde0.arr);
        for (local_ac = 0; local_ac < (uint)in_RDI[1]; local_ac = local_ac + 1) {
          in_stack_fffffffffffffe48 = operator[](in_stack_fffffffffffffdd8,0);
          local_b8.arr = in_stack_fffffffffffffe48.arr;
          in_stack_fffffffffffffe40 = MatrixRow<Rational_&>::operator[](&local_b8,local_ac);
          Rational::operator*=(this_00,in_stack_fffffffffffffe48.arr);
        }
        for (local_bc = 0; uVar2 = local_20, local_bc < (uint)local_10[1]; local_bc = local_bc + 1)
        {
          in_stack_fffffffffffffe38 = operator[](in_stack_fffffffffffffdd8,0);
          local_c8.arr = in_stack_fffffffffffffe38.arr;
          MatrixRow<Rational_&>::operator[](&local_c8,local_bc);
          Rational::operator*=(this_00,in_stack_fffffffffffffe48.arr);
        }
        while (local_cc = uVar2 + 1, local_cc < (uint)in_RDI[1]) {
          local_d8.arr = (Rational *)operator[](in_stack_fffffffffffffdd8,0);
          MatrixRow<Rational_&>::operator[](&local_d8,local_cc);
          bVar1 = Rational::operator_cast_to_bool((Rational *)0x157684);
          uVar2 = local_cc;
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            for (local_dc = 0; local_dc < (uint)local_10[1]; local_dc = local_dc + 1) {
              local_128[0].arr = (Rational *)operator[](in_stack_fffffffffffffdd8,0);
              in_stack_fffffffffffffe08 = MatrixRow<Rational_&>::operator[](local_128,local_dc);
              in_stack_fffffffffffffe00 = operator[](in_stack_fffffffffffffdd8,0);
              local_130.arr = in_stack_fffffffffffffe00.arr;
              MatrixRow<Rational_&>::operator[](&local_130,local_cc);
              ::operator*(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00.arr);
              local_138.arr = (Rational *)operator[](in_stack_fffffffffffffdd8,0);
              MatrixRow<Rational_&>::operator[](&local_138,local_dc);
              Rational::operator-=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38.arr);
              Rational::~Rational(in_stack_fffffffffffffde0.arr);
            }
            Rational::Rational(in_stack_fffffffffffffde0.arr);
            in_stack_fffffffffffffde0 = operator[](in_stack_fffffffffffffdd8,0);
            local_180[0].arr = in_stack_fffffffffffffde0.arr;
            in_stack_fffffffffffffdd8 = MatrixRow<Rational_&>::operator[](local_180,local_cc);
            Rational::operator=(in_stack_fffffffffffffde0.arr,in_stack_fffffffffffffdd8);
            Rational::~Rational(in_stack_fffffffffffffde0.arr);
            uVar2 = local_cc;
          }
        }
        Rational::~Rational(in_stack_fffffffffffffde0.arr);
      }
      return;
    }
    uVar3 = __cxa_allocate_exception(0x10);
    matrix_error::runtime_error
              ((matrix_error *)in_stack_fffffffffffffde0.arr,(char *)in_stack_fffffffffffffdd8);
    __cxa_throw(uVar3,&matrix_error::typeinfo,matrix_error::~matrix_error);
  }
  uVar3 = __cxa_allocate_exception(0x10);
  matrix_error::runtime_error
            ((matrix_error *)in_stack_fffffffffffffde0.arr,(char *)in_stack_fffffffffffffdd8);
  __cxa_throw(uVar3,&matrix_error::typeinfo,matrix_error::~matrix_error);
}

Assistant:

void Matrix<Field>::inverseExt(Matrix &ext)
{
    if(N != M)
        throw matrix_error("Trying to inverse a non-square matrix");
    if(M != ext.M)
    {
        throw matrix_error("Invalid use of inverseExt");
    }
    if(gauss(&ext) != N)
    {
        throw matrix_error("Cannot inverse a singular matrix");
    }
    for(unsigned i = N - 1; i != unsigned(-1); --i)
    {
        Field coeff = Field(1) / (*this)[i][i];
        for(unsigned j = 0; j < N; ++j)
        {
            (*this)[i][j] *= coeff;
        }
        for(unsigned j = 0; j < ext.N; ++j)
        {
            ext[i][j] *= coeff;
        }
        for(unsigned j = i + 1; j < N; j++)
        {
            if(!(*this)[i][j])
                continue;
            for(unsigned q = 0; q < ext.N; q++)
            {
                ext[i][q] -= ext[j][q] * (*this)[i][j];
            }
            (*this)[i][j] = Field();
        }
    }
}